

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int_type __thiscall
nlohmann::detail::input_stream_adapter::get_character(input_stream_adapter *this)

{
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  int_type iVar4;
  _Ios_Iostate __a;
  undefined8 *in_RDI;
  int_type res;
  
  iVar3 = std::streambuf::sbumpc();
  iVar4 = std::char_traits<char>::eof();
  if (iVar3 == iVar4) {
    plVar1 = (long *)*in_RDI;
    uVar2 = *(undefined8 *)(*plVar1 + -0x18);
    __a = std::ios::rdstate();
    std::operator|(__a,_S_eofbit);
    std::ios::clear((int)plVar1 + (int)uVar2);
  }
  return iVar3;
}

Assistant:

std::char_traits<char>::int_type get_character()
    {
        auto res = sb->sbumpc();
        // set eof manually, as we don't use the istream interface.
        if (JSON_HEDLEY_UNLIKELY(res == std::char_traits<char>::eof()))
        {
            is->clear(is->rdstate() | std::ios::eofbit);
        }
        return res;
    }